

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::CheckerInstanceSymbol::serializeTo
          (CheckerInstanceSymbol *this,ASTSerializer *serializer)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  bool bVar1;
  ASTSerializer *in_RSI;
  char *in_RDI;
  Symbol *in_stack_00000028;
  AttributeSymbol *attr;
  iterator __end4;
  iterator __begin4;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *__range4;
  Connection *conn;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL> *__range2;
  Symbol *in_stack_ffffffffffffff28;
  ASTSerializer *in_stack_ffffffffffffff30;
  span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>
  *in_stack_ffffffffffffff38;
  ASTSerializer *this_00;
  ASTSerializer *pAVar2;
  __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
  local_98;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *local_90;
  ASTSerializer *local_78;
  reference local_60;
  Connection *local_58;
  __normal_iterator<const_slang::ast::CheckerInstanceSymbol::Connection_*,_std::span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>_>
  local_50;
  span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL> local_48;
  span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL> *local_38;
  int local_20;
  void *local_18;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
             (char *)in_stack_ffffffffffffff38);
  ASTSerializer::write(in_RSI,local_20,local_18,*(size_t *)(in_RDI + 0x50));
  pAVar2 = local_10;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
             (char *)in_stack_ffffffffffffff38);
  name_00._M_str = in_RDI;
  name_00._M_len = (size_t)pAVar2;
  ASTSerializer::startArray(in_RSI,name_00);
  local_48 = getPortConnections((CheckerInstanceSymbol *)__begin4._M_current);
  local_38 = &local_48;
  local_50._M_current =
       (Connection *)
       std::span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>
                   *)in_stack_ffffffffffffff28);
  local_58 = (Connection *)
             std::span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>
             ::end(in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::CheckerInstanceSymbol::Connection_*,_std::span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::CheckerInstanceSymbol::Connection_*,_std::span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff30,
                       (__normal_iterator<const_slang::ast::CheckerInstanceSymbol::Connection_*,_std::span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff28);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_60 = __gnu_cxx::
               __normal_iterator<const_slang::ast::CheckerInstanceSymbol::Connection_*,_std::span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>_>
               ::operator*(&local_50);
    ASTSerializer::startObject((ASTSerializer *)0xfd0246);
    this_00 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,(char *)local_10);
    name._M_str = (char *)__begin4._M_current;
    name._M_len = (size_t)__end4._M_current;
    ASTSerializer::writeLink((ASTSerializer *)attr,name,in_stack_00000028);
    local_78 = local_10;
    std::
    visit<slang::ast::CheckerInstanceSymbol::serializeTo(slang::ast::ASTSerializer&)const::__0,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>const&>
              ((anon_class_8_1_79d3bf50 *)in_stack_ffffffffffffff30,
               (variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                *)in_stack_ffffffffffffff28);
    bVar1 = std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::empty
                      ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                       0xfd02af);
    if (!bVar1) {
      in_stack_ffffffffffffff30 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,(char *)this_00);
      name_01._M_str = in_RDI;
      name_01._M_len = (size_t)pAVar2;
      ASTSerializer::startArray(in_RSI,name_01);
      local_90 = &local_60->attributes;
      local_98._M_current =
           (AttributeSymbol **)
           std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                      in_stack_ffffffffffffff28);
      std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::end
                ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)this_00);
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                          ((__normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                            *)in_stack_ffffffffffffff30,
                           (__normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                            *)in_stack_ffffffffffffff28);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        __gnu_cxx::
        __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
        ::operator*(&local_98);
        ASTSerializer::serialize(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,false);
        __gnu_cxx::
        __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
        ::operator++(&local_98);
      }
      ASTSerializer::endArray((ASTSerializer *)0xfd036b);
    }
    ASTSerializer::endObject((ASTSerializer *)0xfd0378);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::CheckerInstanceSymbol::Connection_*,_std::span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>_>
    ::operator++(&local_50);
  }
  ASTSerializer::endArray((ASTSerializer *)0xfd0397);
  return;
}

Assistant:

void CheckerInstanceSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("body", body);

    serializer.startArray("connections");
    for (auto& conn : getPortConnections()) {
        serializer.startObject();

        serializer.writeLink("formal", conn.formal);
        std::visit(
            [&](auto&& arg) {
                if (arg)
                    serializer.write("actual", *arg);
            },
            conn.actual);

        if (!conn.attributes.empty()) {
            serializer.startArray("attributes");
            for (auto attr : conn.attributes)
                serializer.serialize(*attr);
            serializer.endArray();
        }

        serializer.endObject();
    }
    serializer.endArray();
}